

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cigar.c
# Opt level: O0

char * parasail_cigar_decode(parasail_cigar_t *cigar)

{
  char cVar1;
  uint32_t uVar2;
  int iVar3;
  int snprintf_retcode;
  uint32_t len;
  char op;
  char tmp [40];
  int local_34;
  ulong uStack_30;
  int i;
  size_t size;
  size_t retlen;
  char *ret;
  parasail_cigar_t *cigar_local;
  
  size = 0;
  uStack_30 = (long)cigar->len * 4;
  retlen = (size_t)malloc(uStack_30 + 1);
  *(undefined1 *)retlen = 0;
  local_34 = 0;
  while( true ) {
    if (cigar->len <= local_34) {
      return (char *)retlen;
    }
    cVar1 = parasail_cigar_decode_op(cigar->seq[local_34]);
    uVar2 = parasail_cigar_decode_len(cigar->seq[local_34]);
    iVar3 = snprintf((char *)&len,0x28,"%u%c",(ulong)uVar2,(ulong)(uint)(int)cVar1);
    if (0x27 < iVar3) break;
    size = (long)iVar3 + size;
    if (uStack_30 <= size) {
      uStack_30 = uStack_30 * 2;
      retlen = (size_t)realloc((void *)retlen,uStack_30 + 1);
    }
    strcat((char *)retlen,(char *)&len);
    local_34 = local_34 + 1;
  }
  fprintf(_stderr,"invalid CIGAR\n");
  free((void *)retlen);
  return (char *)0x0;
}

Assistant:

char* parasail_cigar_decode(parasail_cigar_t *cigar)
{
#define SIZE 40
    char *ret = NULL;
    size_t retlen = 0;
    size_t size = 0;
    int i = 0;

    /* initial allocation for 1 op and 3 number characters per cigar int */
    size = sizeof(char)*cigar->len*4;
    ret = malloc(size+1);
    ret[0] = '\0';

    for (i=0; i<cigar->len; ++i) {
        char tmp[SIZE];
        char op = parasail_cigar_decode_op(cigar->seq[i]);
        uint32_t len = parasail_cigar_decode_len(cigar->seq[i]);
        int snprintf_retcode = snprintf(tmp, SIZE, "%u%c", len, op);
        if (snprintf_retcode >= SIZE) {
            fprintf(stderr, "invalid CIGAR\n");
            free(ret);
            return NULL;
        }
        retlen += snprintf_retcode;
        if (retlen >= size) {
            size *= 2;
            ret = realloc(ret, size+1);
        }
        strcat(ret, tmp);
    }

    return ret;
}